

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O2

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Linear<spoa::InstructionSet<(spoa::Architecture)3,short>>
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  undefined8 *puVar1;
  undefined2 uVar2;
  undefined1 auVar3 [32];
  ushort uVar4;
  AlignmentType AVar5;
  Implementation *pIVar6;
  Node *pNVar7;
  __mxxxi *palVar8;
  pointer ppEVar9;
  Edge *pEVar10;
  undefined1 auVar11 [32];
  bool bVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  type tVar16;
  uint uVar17;
  iterator __begin5_1;
  long lVar18;
  long lVar19;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  pointer ppEVar20;
  undefined4 uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  __mxxxi *palVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  __mxxxi *palVar34;
  ulong uVar35;
  type_conflict *ptVar36;
  uint uVar37;
  Node **it;
  pointer ppNVar38;
  Graph *pGVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  __mxxxi alVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 in_ZMM0 [64];
  int32_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> predecessors;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
  backtrack_storage;
  type unpacked [16];
  uint local_184;
  long local_180;
  type_conflict *local_178;
  long local_170;
  uint local_164;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_160;
  Graph *local_158;
  ulong local_150;
  long local_148;
  undefined1 local_140 [24];
  longlong lStack_128;
  int *local_118;
  ulong local_110;
  ulong local_108;
  pointer local_100;
  uint local_f4;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  pointer local_b0;
  ulong local_a8;
  _Vector_base<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
  local_a0;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  auVar41 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sequence_len);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar41._0_8_ * 0.0625;
  auVar41 = vroundsd_avx(auVar43,auVar43,10);
  local_170 = vcvttsd2usi_avx512f(auVar41);
  uVar17 = 0;
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  uVar35 = 0;
  while ((uVar35 < 0x10 && (uVar17 < 4))) {
    uVar23 = uVar35 + 1;
    *(undefined2 *)((long)&local_80 + uVar35 * 2) = 0x8400;
    uVar30 = uVar23 & uVar35;
    uVar35 = uVar23;
    if (uVar30 == 0) {
      uVar23 = (ulong)uVar17;
      uVar17 = uVar17 + 1;
      palVar25 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->masks + uVar23;
      (*palVar25)[0] = local_80;
      (*palVar25)[1] = lStack_78;
      (*palVar25)[2] = lStack_70;
      (*palVar25)[3] = lStack_68;
    }
  }
  palVar25 = ((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl)->masks;
  palVar25[4][0] = -0x7bff7bff7c000000;
  palVar25[4][1] = -0x7bff7bff7bff7c00;
  palVar25[4][2] = -0x7bff7bff7bff7c00;
  palVar25[4][3] = -0x7bff7bff7bff7c00;
  alVar42 = (__mxxxi)vpbroadcastw_avx512vl();
  *((this->pimpl_)._M_t.
    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ._M_t.
    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    .
    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
   ._M_head_impl)->penalties = alVar42;
  for (lVar18 = 0x20; lVar18 != 0x80; lVar18 = lVar18 + 0x20) {
    palVar25 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl)->penalties;
    auVar44 = *(undefined1 (*) [32])((long)palVar25[-1] + lVar18);
    auVar44 = vpaddw_avx2(auVar44,auVar44);
    *(undefined1 (*) [32])((long)*palVar25 + lVar18) = auVar44;
  }
  ppNVar38 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = (pointer)(graph->rank_to_node_).
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  uVar21 = 0x8400;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    uVar21 = 0;
  }
  uVar23 = (ulong)(sequence_len - 1);
  local_180 = CONCAT44(local_180._4_4_,uVar21);
  local_150 = (ulong)(sequence_len - 1 & 0xf);
  local_148 = CONCAT44(local_148._4_4_,(int)(this->super_AlignmentEngine).g_);
  local_e0 = vpbroadcastw_avx512vl();
  uVar35 = 0xffffffffffffffff;
  local_f0 = local_e0._16_16_;
  local_160 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
              __return_storage_ptr__;
  local_158 = graph;
  local_118 = score;
  local_110 = uVar23;
  for (; pGVar39 = local_158, (pointer)ppNVar38 != local_100; ppNVar38 = ppNVar38 + 1) {
    pIVar6 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    pNVar7 = *ppNVar38;
    lVar18 = *(long *)&(pIVar6->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    ppEVar20 = (pNVar7->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppEVar20 ==
        (pNVar7->inedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar23 = 0;
    }
    else {
      uVar23 = (ulong)(*(int *)(lVar18 + (ulong)(*ppEVar20)->tail->id * 4) + 1);
    }
    palVar34 = pIVar6->H;
    uVar2 = *(undefined2 *)
             (*(long *)&(pIVar6->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl
             + uVar23 * 4);
    lVar19 = (ulong)pNVar7->code * local_170;
    palVar8 = pIVar6->sequence_profile;
    uVar17 = *(int *)(lVar18 + (ulong)pNVar7->id * 4) + 1;
    local_178 = (type_conflict *)CONCAT44(local_178._4_4_,uVar17);
    lVar22 = uVar23 * local_170;
    lVar26 = 0;
    auVar44 = vpsrldq_avx2(ZEXT1632(CONCAT214(uVar2,CONCAT212(uVar2,CONCAT210(uVar2,CONCAT28(uVar2,
                                                  CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2
                                                                                        )))))))),0xe
                          );
    palVar25 = palVar34 + (ulong)uVar17 * local_170;
    lVar18 = local_170;
    while (bVar40 = lVar18 != 0, lVar18 = lVar18 + -1, bVar40) {
      auVar3 = *(undefined1 (*) [32])((long)palVar34[lVar22] + lVar26);
      auVar11 = vperm2f128_avx(auVar3,auVar3,0x28);
      auVar3 = vpalignr_avx2(auVar3,auVar11,0xe);
      auVar44 = vpor_avx2(auVar3,auVar44);
      auVar41 = *(undefined1 (*) [16])((long)palVar34[lVar22] + lVar26 + 0x10);
      *(undefined1 (*) [32])((long)*palVar25 + lVar26) = auVar44;
      auVar3 = vpaddw_avx2(auVar44,*(undefined1 (*) [32])((long)palVar8[lVar19] + lVar26));
      auVar11 = vpaddw_avx2(local_e0,*(undefined1 (*) [32])((long)palVar34[lVar22] + lVar26));
      auVar44 = vpsrldq_avx2(ZEXT1632(auVar41),0xe);
      auVar3 = vpmaxsw_avx2(auVar3,auVar11);
      *(undefined1 (*) [32])((long)*palVar25 + lVar26) = auVar3;
      lVar26 = lVar26 + 0x20;
    }
    for (uVar23 = 1;
        ppEVar20 = ((*ppNVar38)->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
        uVar23 < (ulong)((long)((*ppNVar38)->inedges).
                               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar20 >> 3);
        uVar23 = (ulong)((int)uVar23 + 1)) {
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      uVar30 = (ulong)(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               + (ulong)ppEVar20[uVar23]->tail->id * 4) + 1);
      uVar2 = *(undefined2 *)
               (*(long *)&(pIVar6->first_column).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl + uVar30 * 4);
      lVar22 = uVar30 * local_170;
      palVar34 = pIVar6->H;
      lVar26 = 0;
      auVar44 = vpsrldq_avx2(ZEXT1632(CONCAT214(uVar2,CONCAT212(uVar2,CONCAT210(uVar2,CONCAT28(uVar2
                                                  ,CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,
                                                  uVar2)))))))),0xe);
      lVar18 = local_170;
      while (bVar40 = lVar18 != 0, lVar18 = lVar18 + -1, bVar40) {
        auVar3 = *(undefined1 (*) [32])((long)palVar34[lVar22] + lVar26);
        auVar11 = vperm2f128_avx(auVar3,auVar3,0x28);
        auVar11 = vpalignr_avx2(auVar3,auVar11,0xe);
        auVar3 = vpaddw_avx2(auVar3,local_e0);
        auVar44 = vpor_avx2(auVar11,auVar44);
        auVar44 = vpaddw_avx2(auVar44,*(undefined1 (*) [32])((long)palVar8[lVar19] + lVar26));
        auVar44 = vpmaxsw_avx2(auVar44,auVar3);
        auVar3 = vpmaxsw_avx2(auVar44,*(undefined1 (*) [32])((long)*palVar25 + lVar26));
        auVar44 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                         ((long)palVar34[lVar22] + lVar26 + 0x10)),0xe);
        *(undefined1 (*) [32])((long)*palVar25 + lVar26) = auVar3;
        lVar26 = lVar26 + 0x20;
      }
    }
    local_140._8_8_ = 0x8400840084008400;
    local_140._0_8_ = 0x8400840084008400;
    local_140._16_8_ = (pointer)0x8400840084008400;
    lStack_128 = -0x7bff7bff7bff7c00;
    auVar41 = vpbroadcastw_avx512vl();
    auVar44 = vpsrldq_avx2(ZEXT1632(auVar41),0xe);
    palVar34 = palVar25;
    lVar18 = local_170;
    local_108 = uVar35;
    while (ptVar36 = (type_conflict *)local_108, uVar23 = local_110, bVar40 = lVar18 != 0,
          lVar18 = lVar18 + -1, bVar40) {
      auVar44 = vorpd_avx(auVar44,(undefined1  [32])
                                  ((this->pimpl_)._M_t.
                                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                   .
                                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                                  ._M_head_impl)->masks[4]);
      alVar42 = (__mxxxi)vpmaxsw_avx2(auVar44,(undefined1  [32])*palVar34);
      *palVar34 = alVar42;
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_prefix_max
                (palVar34,pIVar6->masks,pIVar6->penalties);
      alVar42 = *palVar34;
      auVar41 = vpaddw_avx(local_f0,*(undefined1 (*) [16])(*palVar34 + 2));
      if ((this->super_AlignmentEngine).type_ == kSW) {
        alVar42 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar42,_DAT_0013d400);
        *palVar34 = alVar42;
      }
      _local_140 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar42,(undefined1  [32])_local_140);
      auVar44 = vpsrldq_avx2(ZEXT1632(auVar41),0xe);
      palVar34 = palVar34 + 1;
    }
    AVar5 = (this->super_AlignmentEngine).type_;
    if (AVar5 == kSW) {
      tVar16 = _mmxxx_max_value<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,short>>
                         ((__mxxxi *)local_140);
      uVar21 = (undefined4)CONCAT62(extraout_var_00,tVar16);
      ptVar36 = (type_conflict *)local_108;
      uVar23 = local_110;
LAB_00119c79:
      if ((short)local_180 < (short)uVar21) {
        ptVar36 = local_178;
      }
      if ((short)uVar21 < (short)local_180) {
        uVar21 = (uint)local_180;
      }
      local_180 = CONCAT44(local_180._4_4_,uVar21);
      uVar35 = (ulong)ptVar36 & 0xffffffff;
    }
    else {
      uVar35 = local_108;
      if (AVar5 == kNW) {
        if (((*ppNVar38)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            ((*ppNVar38)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          palVar25 = palVar25 + local_170 + -1;
          local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(*palVar25)[0];
          local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(*palVar25)[1];
          local_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(*palVar25)[2];
          lStack_88 = (*palVar25)[3];
          uVar4 = *(ushort *)
                   ((long)&local_a0._M_impl.super__Vector_impl_data._M_start + local_150 * 2);
          if ((short)local_180 < (short)uVar4) {
            ptVar36 = local_178;
          }
          uVar35 = (ulong)ptVar36 & 0xffffffff;
          uVar17 = (uint)local_180;
          if ((short)local_180 <= (short)uVar4) {
            uVar17 = (uint)uVar4;
          }
          local_180 = CONCAT44(local_180._4_4_,uVar17);
        }
      }
      else if ((AVar5 == kOV) &&
              (((*ppNVar38)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start ==
               ((*ppNVar38)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_finish)) {
        tVar16 = _mmxxx_max_value<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,short>>
                           ((__mxxxi *)local_140);
        uVar21 = (undefined4)CONCAT62(extraout_var,tVar16);
        goto LAB_00119c79;
      }
    }
  }
  iVar28 = (int)uVar35;
  if (iVar28 == -1) {
    *(pointer *)(local_160 + 0x10) = (pointer)0x0;
    *(undefined1 (*) [16])local_160 = (undefined1  [16])0x0;
    return (Alignment *)local_160;
  }
  if (local_118 != (int *)0x0) {
    *local_118 = (int)(short)local_180;
  }
  AVar5 = (this->super_AlignmentEngine).type_;
  if (AVar5 == kOV) {
    pNVar7 = (local_158->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar28 + -1];
    if ((pNVar7->outedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(pNVar7->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl + 8)) goto LAB_00119d22;
  }
  else {
    if (AVar5 == kNW) goto LAB_00119d22;
    if (AVar5 != kSW) {
      uVar23 = 0xffffffffffffffff;
      goto LAB_00119d22;
    }
  }
  uVar17 = _mmxxx_index_of<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,short>>
                     (((this->pimpl_)._M_t.
                       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       .
                       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                      ._M_head_impl)->H + iVar28 * local_170,(uint32_t)local_170,(short)local_180);
  uVar23 = (ulong)uVar17;
LAB_00119d22:
  uVar30 = 1;
  for (uVar24 = 0; uVar17 = (uint)uVar30, (uVar35 & 0xffffffff) != uVar24; uVar24 = uVar24 + 1) {
    pNVar7 = (pGVar39->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar24];
    uVar29 = (ulong)((long)*(pointer *)
                            ((long)&(pNVar7->inedges).
                                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                    ._M_impl + 8) -
                    *(long *)&(pNVar7->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl.super__Vector_impl_data) >> 3;
    if ((uint)uVar29 < uVar17) {
      uVar29 = uVar30;
    }
    uVar30 = uVar29 & 0xffffffff;
  }
  std::
  vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
  ::vector((vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
            *)&local_a0,(ulong)(uVar17 * 0x20 + 0x30),(allocator_type *)local_140);
  local_150 = local_150 & 0xffffffff00000000;
  uVar31 = 0;
  local_100 = local_a0._M_impl.super__Vector_impl_data._M_start + 1;
  local_e0._0_8_ = local_a0._M_impl.super__Vector_impl_data._M_start;
  local_f0._0_8_ = local_a0._M_impl.super__Vector_impl_data._M_start[1].arr + (uVar17 << 4);
  local_178 = local_a0._M_impl.super__Vector_impl_data._M_start[1].arr + (uVar17 << 4) +
              (uVar17 << 4);
  local_140._16_8_ = 0;
  _local_140 = (__mxxxi)(ZEXT1632(stack0xfffffffffffffed0) << 0x80);
  *(pointer *)(local_160 + 0x10) = (pointer)0x0;
  *(undefined1 (*) [16])local_160 = (undefined1  [16])0x0;
  bVar40 = true;
  local_164 = (uint)uVar23;
  while( true ) {
    iVar28 = (int)uVar35;
    if (((int)uVar23 == -1) || (iVar28 == 0)) break;
    local_118 = (int *)CONCAT44(local_118._4_4_,uVar31);
    uVar30 = uVar23 >> 4 & 0xfffffff;
    local_148 = (long)(iVar28 + -1);
    local_180 = (long)iVar28;
    if (bVar40) {
      if (local_140._8_8_ != local_140._0_8_) {
        local_140._8_8_ = local_140._0_8_;
      }
      local_b0 = (pGVar39->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      palVar25 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->H + local_180 * local_170 + uVar30;
      lVar13 = (*palVar25)[1];
      lVar14 = (*palVar25)[2];
      lVar15 = (*palVar25)[3];
      *(longlong *)local_e0._0_8_ = (*palVar25)[0];
      *(longlong *)(local_e0._0_8_ + 8) = lVar13;
      *(longlong *)(local_e0._0_8_ + 0x10) = lVar14;
      *(longlong *)(local_e0._0_8_ + 0x18) = lVar15;
      ppEVar20 = (local_b0[local_148]->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar9 = *(pointer *)
                 ((long)&(local_b0[local_148]->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      local_110 = uVar23;
      local_108 = uVar35;
      local_a8 = uVar30;
      if (ppEVar20 == ppEVar9) {
        local_184 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,
                   (int *)&local_184);
        palVar25 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H + uVar30;
        lVar13 = (*palVar25)[1];
        lVar14 = (*palVar25)[2];
        lVar15 = (*palVar25)[3];
        *(longlong *)local_100->arr = (*palVar25)[0];
        *(longlong *)(local_100->arr + 4) = lVar13;
        *(longlong *)(local_100->arr + 8) = lVar14;
        *(longlong *)(local_100->arr + 0xc) = lVar15;
      }
      else {
        uVar35 = 0;
        for (; ppEVar20 != ppEVar9; ppEVar20 = ppEVar20 + 1) {
          local_184 = *(int *)(*(long *)&(((this->pimpl_)._M_t.
                                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                           .
                                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                                          ._M_head_impl)->node_id_to_rank).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              + (ulong)(*ppEVar20)->tail->id * 4) + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,&local_184);
          palVar25 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H + (ulong)*(uint *)(local_140._8_8_ + -4) * local_170 + uVar30
          ;
          lVar13 = (*palVar25)[1];
          lVar14 = (*palVar25)[2];
          lVar15 = (*palVar25)[3];
          ptVar36 = local_100->arr + uVar35;
          *(longlong *)ptVar36 = (*palVar25)[0];
          *(longlong *)(ptVar36 + 4) = lVar13;
          *(longlong *)(ptVar36 + 8) = lVar14;
          *(longlong *)(ptVar36 + 0xc) = lVar15;
          uVar35 = (ulong)((int)uVar35 + 0x10);
        }
      }
      palVar25 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->sequence_profile +
                 (ulong)local_b0[local_148]->code * local_170 + uVar30;
      lVar13 = (*palVar25)[1];
      lVar14 = (*palVar25)[2];
      lVar15 = (*palVar25)[3];
      *(longlong *)(local_178 + 0x10) = (*palVar25)[0];
      *(longlong *)(local_178 + 0x14) = lVar13;
      *(longlong *)(local_178 + 0x18) = lVar14;
      *(longlong *)(local_178 + 0x1c) = lVar15;
      uVar30 = local_a8;
      uVar35 = local_108;
      uVar23 = local_110;
    }
    uVar37 = (uint)uVar23;
    uVar17 = uVar37 & 0xf;
    if (((this->super_AlignmentEngine).type_ == kSW) &&
       (*(short *)(local_e0._0_8_ + (ulong)uVar17 * 2) == 0)) goto LAB_0011a34b;
    if ((uVar23 & 0xf) == 0) {
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      if (uVar37 < 0x10) {
        lVar18 = *(long *)&(pIVar6->first_column).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl;
        local_178[0xf] = *(type_conflict *)(lVar18 + local_180 * 4);
        uVar31 = 0xf;
        for (uVar32 = 0; (ulong)uVar32 < (ulong)((long)(local_140._8_8_ - local_140._0_8_) >> 2);
            uVar32 = uVar32 + 1) {
          uVar30 = (ulong)uVar31;
          uVar31 = uVar31 + 0x10;
          *(undefined2 *)(local_f0._0_8_ + uVar30 * 2) =
               *(undefined2 *)(lVar18 + (ulong)*(uint *)(local_140._0_8_ + (ulong)uVar32 * 4) * 4);
        }
      }
      else {
        palVar25 = pIVar6->H + local_180 * local_170 + (uVar30 - 1);
        lVar13 = *(longlong *)((long)*palVar25 + 8);
        lVar14 = *(longlong *)((long)*palVar25 + 0x10);
        lVar15 = *(longlong *)((long)*palVar25 + 0x18);
        *(longlong *)local_178 = (*palVar25)[0];
        *(longlong *)(local_178 + 4) = lVar13;
        *(longlong *)(local_178 + 8) = lVar14;
        *(longlong *)(local_178 + 0xc) = lVar15;
        uVar24 = 0;
        for (uVar31 = 0; (ulong)uVar31 < (ulong)((long)(local_140._8_8_ - local_140._0_8_) >> 2);
            uVar31 = uVar31 + 1) {
          palVar25 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H +
                     (ulong)*(uint *)(local_140._0_8_ + (ulong)uVar31 * 4) * local_170 +
                     (uVar30 - 1);
          lVar13 = *(longlong *)((long)*palVar25 + 8);
          lVar14 = *(longlong *)((long)*palVar25 + 0x10);
          lVar15 = *(longlong *)((long)*palVar25 + 0x18);
          puVar1 = (undefined8 *)(local_f0._0_8_ + uVar24 * 2);
          *puVar1 = (*palVar25)[0];
          puVar1[1] = lVar13;
          puVar1[2] = lVar14;
          puVar1[3] = lVar15;
          uVar24 = (ulong)((int)uVar24 + 0x10);
        }
      }
    }
    uVar31 = uVar17 - 1;
    uVar27 = 0;
    uVar30 = (long)(local_140._8_8_ - local_140._0_8_) >> 2;
    uVar32 = 0xf;
    while( true ) {
      if (uVar30 <= uVar27) break;
      if ((uVar23 & 0xf) == 0) {
        if ((int)local_178[0x10] + (int)*(short *)(local_f0._0_8_ + (ulong)uVar32 * 2) ==
            (int)*(short *)local_e0._0_8_) goto LAB_0011a082;
      }
      else if ((int)*(short *)((long)local_178 + (ulong)(uVar17 * 2) + 0x20) +
               (int)*(short *)(local_e0._0_8_ + ((ulong)uVar31 + 0x10) * 2) ==
               (int)*(short *)(local_e0._0_8_ + (ulong)(uVar17 * 2))) {
LAB_0011a082:
        uVar17 = *(uint *)(local_140._0_8_ + (ulong)uVar27 * 4);
        uVar31 = uVar37 - 1;
        goto LAB_0011a1c9;
      }
      uVar27 = uVar27 + 1;
      uVar31 = uVar31 + 0x10;
      uVar32 = uVar32 + 0x10;
    }
    iVar28 = (int)(this->super_AlignmentEngine).g_;
    uVar24 = 0;
    uVar31 = uVar17;
    do {
      uVar33 = uVar24;
      uVar29 = (ulong)uVar31;
      if (uVar30 <= uVar33) {
        if ((uVar23 & 0xf) == 0) {
          bVar40 = iVar28 + local_178[0xf] == (int)*(short *)local_e0._0_8_;
        }
        else {
          bVar40 = iVar28 + *(short *)(local_e0._0_8_ + ((ulong)uVar17 - 1) * 2) ==
                   (int)*(short *)(local_e0._0_8_ + (ulong)uVar17 * 2);
        }
        uVar17 = (uint)local_150;
        uVar31 = (uint)local_118;
        if (!bVar40) goto LAB_0011a1c9;
        uVar31 = uVar37 - 1;
        goto LAB_0011a1d6;
      }
      uVar31 = uVar31 + 0x10;
      uVar24 = (ulong)((int)uVar33 + 1);
    } while (*(short *)(local_e0._0_8_ + (uVar29 + 0x10) * 2) + iVar28 !=
             (int)*(short *)(local_e0._0_8_ + (ulong)uVar17 * 2));
    uVar17 = *(uint *)(local_140._0_8_ + uVar33 * 4);
    uVar31 = uVar37;
LAB_0011a1c9:
    if ((uint)uVar35 == uVar17) {
      uVar35 = (ulong)uVar17;
LAB_0011a1d6:
      local_184 = 0xffffffff;
      bVar12 = true;
    }
    else {
      bVar12 = false;
      uVar35 = (ulong)uVar17;
      local_184 = (local_158->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_148]->id;
    }
    local_f4 = uVar37;
    if (uVar37 == uVar31) {
      local_f4 = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,int>(local_160,&local_184,(int *)&local_f4);
    bVar40 = true;
    if (bVar12) {
      bVar40 = (~uVar31 & 0xf) == 0 && uVar37 != uVar31;
    }
    local_150 = CONCAT44(local_150._4_4_,(int)uVar35);
    uVar23 = (ulong)uVar31;
    pGVar39 = local_158;
    local_164 = uVar31;
  }
  if ((this->super_AlignmentEngine).type_ == kNW) {
    if ((iVar28 == 0) && ((int)uVar23 != -1)) {
      uVar23 = 0xffffffffffffffff;
      do {
        local_184 = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (local_160,(int *)&local_184,(int *)&local_164);
        bVar40 = local_164 != 0;
        local_164 = local_164 - 1;
        pGVar39 = local_158;
      } while (bVar40);
    }
    while ((uVar17 = (uint)uVar35, uVar17 != 0 && ((int)uVar23 == -1))) {
      lVar18 = (long)(int)uVar17;
      local_184 = 0xffffffff;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int&,int>
                (local_160,
                 &(pGVar39->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar18 + -1]->id,(int *)&local_184);
      pNVar7 = (pGVar39->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[lVar18 + -1];
      ppEVar20 = (pNVar7->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar9 = *(pointer *)
                 ((long)&(pNVar7->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      if (ppEVar20 == ppEVar9) {
        uVar31 = 0;
      }
      else {
        pIVar6 = (this->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 .
                 super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl;
        do {
          uVar31 = uVar17;
          if (ppEVar20 == ppEVar9) break;
          pEVar10 = *ppEVar20;
          lVar19 = *(long *)&(pIVar6->first_column).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl;
          ppEVar20 = ppEVar20 + 1;
          uVar31 = *(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           + (ulong)pEVar10->tail->id * 4) + 1;
        } while (*(int *)(lVar19 + lVar18 * 4) !=
                 *(int *)(lVar19 + (ulong)uVar31 * 4) + (int)(this->super_AlignmentEngine).g_);
      }
      uVar35 = (ulong)uVar31;
      pGVar39 = local_158;
      uVar23 = (ulong)local_164;
    }
  }
LAB_0011a34b:
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (*(undefined8 *)local_160,*(pointer *)(local_160 + 8));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_140);
  std::
  _Vector_base<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
  ::~_Vector_base(&local_a0);
  return (Alignment *)local_160;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::uint64_t normal_matrix_width = sequence_len;
  std::uint64_t matrix_width =
      std::ceil(static_cast<double>(sequence_len) / T::kNumVar);
  const auto& rank_to_node = graph.rank_to_node();

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {0};  // NOLINT

  for (std::uint32_t i = 0, j = 0; i < T::kNumVar && j < T::kLogNumVar; ++i) {
    unpacked[i] = kNegativeInfinity;
    if ((i & (i + 1)) == 0) {
      pimpl_->masks[j++] = _mmxxx_load_si(
        reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }
  pimpl_->masks[T::kLogNumVar] = _mmxxx_slli_si(
      T::_mmxxx_set1_epi(kNegativeInfinity),
      T::kLSS);

  pimpl_->penalties[0] = T::_mmxxx_set1_epi(g_);
  for (std::uint32_t i = 1; i < T::kLogNumVar; ++i) {
    pimpl_->penalties[i] = T::_mmxxx_add_epi(
        pimpl_->penalties[i - 1],
        pimpl_->penalties[i - 1]);
  }

  typename T::type max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;  // NOLINT
  std::int32_t max_i = -1;
  std::int32_t max_j = -1;
  std::uint32_t last_column_id = (normal_matrix_width - 1) % T::kNumVar;
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);
  __mxxxi g = T::_mmxxx_set1_epi(g_);

  // alignment
  for (const auto& it : rank_to_node) {
    __mxxxi* char_profile = &(pimpl_->sequence_profile[it->code * matrix_width]);  // NOLINT

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    __mxxxi* H_row = &(pimpl_->H[i * matrix_width]);
    __mxxxi* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    __mxxxi x = _mmxxx_srli_si(
        T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // get diagonal
      __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
      H_row[j] = _mmxxx_or_si(
          _mmxxx_slli_si(H_pred_row[j], T::kLSS),
          x);
      x = t1;

      // update M
      H_row[j] = T::_mmxxx_max_epi(
          T::_mmxxx_add_epi(H_row[j], char_profile[j]),
          T::_mmxxx_add_epi(H_pred_row[j], g));
    }
    // check other predecessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      x = _mmxxx_srli_si(
          T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
          T::kRSS);

      for (std::uint64_t j = 0; j < matrix_width; ++j) {
        // get diagonal
        __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
        __mxxxi m = _mmxxx_or_si(
            _mmxxx_slli_si(H_pred_row[j], T::kLSS),
            x);
        x = t1;

        // updage M
        H_row[j] = T::_mmxxx_max_epi(
            H_row[j],
            T::_mmxxx_max_epi(
                T::_mmxxx_add_epi(m, char_profile[j]),
                T::_mmxxx_add_epi(H_pred_row[j], g)));
      }
    }

    __mxxxi score = T::_mmxxx_set1_epi(kNegativeInfinity);
    x = _mmxxx_srli_si(
        T::_mmxxx_add_epi(
            T::_mmxxx_set1_epi(pimpl_->first_column[i]),
            g),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // add last element of previous vector into this one
      H_row[j] = T::_mmxxx_max_epi(
          H_row[j],
          _mmxxx_or_si(x, pimpl_->masks[T::kLogNumVar]));

      T::_mmxxx_prefix_max(H_row[j], pimpl_->masks, pimpl_->penalties);

      x = _mmxxx_srli_si(
          T::_mmxxx_add_epi(H_row[j], g),
          T::kRSS);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = T::_mmxxx_max_epi(H_row[j], zeroes);
      }
      score = T::_mmxxx_max_epi(score, H_row[j]);
    }

    if (type_ == AlignmentType::kSW) {
      std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
      if (max_score < max_row_score) {
        max_score = max_row_score;
        max_i = i;
      }
    } else if (type_ == AlignmentType::kOV) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    } else if (type_ == AlignmentType::kNW) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_value_at<A, T>(
            H_row[matrix_width - 1],
            last_column_id);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    }
  }

  if (max_i == -1 && max_j == -1) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  if (type_ == AlignmentType::kSW) {
    max_j = _mmxxx_index_of<A, T>(
        &(pimpl_->H[max_i * matrix_width]),
        matrix_width,
        max_score);
  } else if (type_ == AlignmentType::kOV) {
    if (rank_to_node[max_i - 1]->outedges.empty()) {
      max_j = _mmxxx_index_of<A, T>(
          &(pimpl_->H[max_i * matrix_width]),
          matrix_width,
          max_score);
    } else {
      max_j = normal_matrix_width - 1;
    }
  } else if (type_ == AlignmentType::kNW) {
    max_j = normal_matrix_width - 1;
  }

  // backtrack
  std::uint32_t max_num_predecessors = 1;
  for (std::uint32_t i = 0; i < static_cast<std::uint32_t>(max_i); ++i) {
    max_num_predecessors = std::max(
        max_num_predecessors,
        static_cast<std::uint32_t>(rank_to_node[i]->inedges.size()));
  }

  std::vector<typename T::Storage> backtrack_storage(3 * T::kNumVar + 2 * T::kNumVar * max_num_predecessors);
  typename T::type* H = reinterpret_cast<typename T::type*>(backtrack_storage.data());
  typename T::type* H_pred = H + T::kNumVar;
  typename T::type* H_diag_pred = H_pred + T::kNumVar * max_num_predecessors;
  typename T::type* H_left_pred = H_diag_pred + T::kNumVar * max_num_predecessors;  // NOLINT
  typename T::type* profile = H_left_pred + T::kNumVar;

  std::vector<std::uint32_t> predecessors;

  std::int32_t i = max_i;
  std::int32_t j = max_j;
  std::int32_t prev_i = 0, prev_j = 0;

  std::uint32_t j_div = j / T::kNumVar;
  std::uint32_t j_mod = j % T::kNumVar;

  bool load_next_segment = true;

  Alignment alignment;

  do {
    // check stop condition
    if (j == -1 || i == 0) {
      break;
    }

    const auto& it = rank_to_node[i - 1];
    // load everything
    if (load_next_segment) {
      predecessors.clear();

      // load current cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(H),
          pimpl_->H[i * matrix_width + j_div]);

      // load predecessors cells
      if (it->inedges.empty()) {
        predecessors.emplace_back(0);
        _mmxxx_store_si(reinterpret_cast<__mxxxi*>(H_pred), pimpl_->H[j_div]);
      } else {
        std::uint32_t store_pos = 0;
        for (const auto& jt : it->inedges) {
          predecessors.emplace_back(pimpl_->node_id_to_rank[jt->tail->id] + 1);
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_pred[store_pos * T::kNumVar]),
              pimpl_->H[predecessors.back() * matrix_width + j_div]);
          ++store_pos;
        }
      }

      // load query profile cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(profile),
          pimpl_->sequence_profile[it->code * matrix_width + j_div]);
    }

    // check stop condition
    if (type_ == AlignmentType::kSW && H[j_mod] == 0) {
      break;
    }

    if (j_mod == 0) {
      // border case
      if (j_div > 0) {
        _mmxxx_store_si(
            reinterpret_cast<__mxxxi*>(H_left_pred),
            pimpl_->H[i * matrix_width + j_div - 1]);

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_diag_pred[p * T::kNumVar]),
              pimpl_->H[predecessors[p] * matrix_width + (j_div - 1)]);
        }
      } else {
        H_left_pred[T::kNumVar - 1] = pimpl_->first_column[i];

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          H_diag_pred[(p + 1) * T::kNumVar - 1] =
              pimpl_->first_column[predecessors[p]];
        }
      }
    }

    // find best predecessor cell
    bool predecessor_found = false;

    if (i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if ((j_mod == 0 && H[j_mod] == H_diag_pred[(p + 1) * T::kNumVar - 1] + profile[j_mod]) ||  // NOLINT
            (j_mod != 0 && H[j_mod] == H_pred[p * T::kNumVar + j_mod - 1] + profile[j_mod])) {  // NOLINT
          prev_i = predecessors[p];
          prev_j = j - 1;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found && i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if (H[j_mod] == H_pred[p * T::kNumVar + j_mod] + g_) {
          prev_i = predecessors[p];
          prev_j = j;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found) {
      if ((j_mod == 0 && H[j_mod] == H_left_pred[T::kNumVar - 1] + g_) ||
          (j_mod != 0 && H[j_mod] == H[j_mod - 1] + g_)) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j);

    // update for next round
    load_next_segment =
        (i == prev_i ? false : true) ||
        (j != prev_j && prev_j % T::kNumVar == T::kNumVar - 1 ? true : false);

    i = prev_i;
    j = prev_j;
    j_div = j / T::kNumVar;
    j_mod = j % T::kNumVar;
  } while (true);

  // update alignment for NW (backtrack stops on first row or column)
  if (type_ == AlignmentType::kNW) {
    while (i == 0 && j != -1) {
      alignment.emplace_back(-1, j);
      --j;
    }
    while (i != 0 && j == -1) {
      alignment.emplace_back(rank_to_node[i - 1]->id, -1);

      const auto& it = rank_to_node[i - 1];
      if (it->inedges.empty()) {
          i = 0;
      } else {
        for (const auto& jt : it->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[jt->tail->id] + 1;
          if (pimpl_->first_column[i] == pimpl_->first_column[pred_i] + g_) {
            i = pred_i;
            break;
          }
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
#else
  (void) sequence_len;
  (void) graph;
  (void) score;
  return Alignment();
#endif
}